

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O0

bool __thiscall ON_RTreeIterator::Next(ON_RTreeIterator *this)

{
  int iVar1;
  StackElement **sp_00;
  ON_RTreeIterator *local_28;
  StackElement *sp;
  StackElement *sp0;
  ON_RTreeIterator *this_local;
  
  if (this->m_sp == (StackElement *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    iVar1 = this->m_sp->m_branchIndex + 1;
    this->m_sp->m_branchIndex = iVar1;
    if (iVar1 < this->m_sp->m_node->m_count) {
      this_local._7_1_ = true;
    }
    else {
      local_28 = (ON_RTreeIterator *)this->m_sp;
      this->m_sp = (StackElement *)0x0;
      do {
        if (local_28 <= this) {
          return false;
        }
        sp_00 = &local_28[-1].m_sp;
        iVar1 = *(int *)&local_28[-1].m_root + 1;
        *(int *)&local_28[-1].m_root = iVar1;
        local_28 = (ON_RTreeIterator *)sp_00;
      } while (*(int *)((long)&(*sp_00)->m_node + 4) <= iVar1);
      this_local._7_1_ = PushChildren(this,(StackElement *)sp_00,true);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_RTreeIterator::Next()
{ 
  if ( 0 == m_sp )
    return false; // invalid iterator

  if ( ++(m_sp->m_branchIndex) < m_sp->m_node->m_count )
    return true; // m_sp->m_node is always at leaf level

  // pop the stack until we find an element with room to move over.
  StackElement* sp0 = &m_stack[0];
  StackElement* sp = m_sp;
  m_sp = 0;
  while ( sp > sp0 )
  {        
    sp--; // pop the stack

    // ++(sp->m_branchIndex) moves to the next element in sp->m_node.
    if ( ++(sp->m_branchIndex) >= sp->m_node->m_count )
      continue; // this element is used up

    // Since we've popped the stack, we cannot be at the leaf level.
    // PushFirst() pushes the first child onto the stack until 
    // it reaches the leaf level.
    return PushChildren(sp,true);
  }
  return false; // we were at the last element and now there are no more.
}